

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ForeverStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeverStatementSyntax,slang::syntax::ForeverStatementSyntax_const&>
          (BumpAllocator *this,ForeverStatementSyntax *args)

{
  ForeverStatementSyntax *this_00;
  
  this_00 = (ForeverStatementSyntax *)allocate(this,0x70,8);
  slang::syntax::ForeverStatementSyntax::ForeverStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }